

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O0

int send_pending_events(TELEMETRY_MESSENGER_INSTANCE_conflict *instance)

{
  BINARY_DATA amqp_data;
  int iVar1;
  MESSENGER_SEND_EVENT_CALLER_INFORMATION *caller_info_00;
  LIST_ITEM_HANDLE pLVar2;
  undefined4 local_9c;
  LOGGER_LOG p_Stack_98;
  TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT send_result;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  uint64_t max_messagesize;
  SEND_PENDING_EVENTS_STATE send_pending_events_state;
  BINARY_DATA body_binary_data;
  MESSENGER_SEND_EVENT_CALLER_INFORMATION *caller_info;
  int result;
  TELEMETRY_MESSENGER_INSTANCE_conflict *instance_local;
  
  caller_info._4_4_ = 0;
  memset(&max_messagesize,0,0x18);
  memset(&send_pending_events_state.bytes_pending,0,0x10);
  l = (LOGGER_LOG)0x0;
  do {
    caller_info_00 = get_next_caller_message_to_send(instance);
    if (caller_info_00 == (MESSENGER_SEND_EVENT_CALLER_INFORMATION *)0x0) {
LAB_0014475d:
      if (((caller_info._4_4_ == 0) &&
          (send_pending_events_state.message_batch_container != (MESSAGE_HANDLE)0x0)) &&
         (iVar1 = send_batched_message_and_reset_state
                            (instance,(SEND_PENDING_EVENTS_STATE *)&max_messagesize), iVar1 != 0)) {
        p_Stack_98 = xlogging_get_log_function();
        if (p_Stack_98 != (LOGGER_LOG)0x0) {
          (*p_Stack_98)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                        ,"send_pending_events",0x4ec,1,"send_batched_message_and_reset_state failed"
                       );
        }
        caller_info._4_4_ = 0x4ed;
      }
      if (send_pending_events_state.bytes_pending != 0) {
        free((void *)send_pending_events_state.bytes_pending);
      }
      if (max_messagesize != 0) {
        local_9c = 2;
        singlylinkedlist_foreach
                  (*(SINGLYLINKEDLIST_HANDLE *)max_messagesize,invoke_callback,&local_9c);
        remove_event_from_in_progress_list((MESSENGER_SEND_EVENT_TASK *)max_messagesize);
        free_task((MESSENGER_SEND_EVENT_TASK *)max_messagesize);
      }
      if (send_pending_events_state.task != (MESSENGER_SEND_EVENT_TASK *)0x0) {
        message_destroy((MESSAGE_HANDLE)send_pending_events_state.task);
      }
      return caller_info._4_4_;
    }
    if (send_pending_events_state.bytes_pending != 0) {
      free((void *)send_pending_events_state.bytes_pending);
    }
    memset(&send_pending_events_state.bytes_pending,0,0x10);
    if ((l == (LOGGER_LOG)0x0) &&
       (iVar1 = get_max_message_size_for_batching(instance,(uint64_t *)&l), iVar1 != 0)) {
      l_1 = xlogging_get_log_function();
      if (l_1 != (LOGGER_LOG)0x0) {
        (*l_1)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
               ,"send_pending_events",0x4a1,1,"get_max_message_size_for_batching failed");
      }
      invoke_callback_on_error
                (caller_info_00,TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_ERROR_FAIL_SENDING);
      free(caller_info_00);
      caller_info._4_4_ = 0x4a4;
      goto LAB_0014475d;
    }
    if ((max_messagesize == 0) &&
       (iVar1 = create_send_pending_events_state
                          (instance,(SEND_PENDING_EVENTS_STATE *)&max_messagesize), iVar1 != 0)) {
      l_2 = xlogging_get_log_function();
      if (l_2 != (LOGGER_LOG)0x0) {
        (*l_2)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
               ,"send_pending_events",0x4a9,1,"create_send_pending_events_state failed");
      }
      invoke_callback_on_error
                (caller_info_00,TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_ERROR_FAIL_SENDING);
      free(caller_info_00);
      caller_info._4_4_ = 0x4ac;
      goto LAB_0014475d;
    }
    iVar1 = message_create_uamqp_encoding_from_iothub_message
                      ((MESSAGE_HANDLE)send_pending_events_state.task,
                       caller_info_00->message->messageHandle,
                       (BINARY_DATA *)&send_pending_events_state.bytes_pending);
    if (iVar1 == 0) {
      if ((uchar *)(long)(int)l < body_binary_data.bytes) {
        l_4 = xlogging_get_log_function();
        if (l_4 != (LOGGER_LOG)0x0) {
          (*l_4)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                 ,"send_pending_events",0x4b8,1,
                 "a single message will encode to be %lu bytes, larger than max we will send the link %lu.  Will continue to try to process messages"
                 ,body_binary_data.bytes,l);
        }
        invoke_callback_on_error
                  (caller_info_00,TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_ERROR_FAIL_SENDING)
        ;
        free(caller_info_00);
      }
      else {
        if ((max_messagesize == 0) ||
           (pLVar2 = singlylinkedlist_add
                               (*(SINGLYLINKEDLIST_HANDLE *)max_messagesize,caller_info_00),
           pLVar2 == (LIST_ITEM_HANDLE)0x0)) {
          l_5 = xlogging_get_log_function();
          if (l_5 != (LOGGER_LOG)0x0) {
            (*l_5)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                   ,"send_pending_events",0x4c0,1,"singlylinkedlist_add failed");
          }
          invoke_callback_on_error
                    (caller_info_00,
                     TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_ERROR_FAIL_SENDING);
          free(caller_info_00);
          caller_info._4_4_ = 0x4c3;
          goto LAB_0014475d;
        }
        if (l < body_binary_data.bytes + (long)send_pending_events_state.message_batch_container) {
          iVar1 = send_batched_message_and_reset_state
                            (instance,(SEND_PENDING_EVENTS_STATE *)&max_messagesize);
          if (iVar1 != 0) {
            l_6 = xlogging_get_log_function();
            if (l_6 != (LOGGER_LOG)0x0) {
              (*l_6)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                     ,"send_pending_events",0x4d0,1,"send_batched_message_and_reset_state failed");
            }
            caller_info._4_4_ = 0x4d1;
            goto LAB_0014475d;
          }
          iVar1 = create_send_pending_events_state
                            (instance,(SEND_PENDING_EVENTS_STATE *)&max_messagesize);
          if (iVar1 != 0) {
            l_7 = xlogging_get_log_function();
            if (l_7 != (LOGGER_LOG)0x0) {
              (*l_7)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                     ,"send_pending_events",0x4d8,1,
                     "create_send_pending_events_state failed, result");
            }
            caller_info._4_4_ = 0x4d9;
            goto LAB_0014475d;
          }
        }
        amqp_data.length = (size_t)body_binary_data.bytes;
        amqp_data.bytes = (uchar *)send_pending_events_state.bytes_pending;
        iVar1 = message_add_body_amqp_data((MESSAGE_HANDLE)send_pending_events_state.task,amqp_data)
        ;
        if (iVar1 != 0) {
          l_8 = xlogging_get_log_function();
          if (l_8 != (LOGGER_LOG)0x0) {
            (*l_8)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                   ,"send_pending_events",0x4e0,1,"message_add_body_amqp_data failed");
          }
          caller_info._4_4_ = 0x4e1;
          goto LAB_0014475d;
        }
        send_pending_events_state.message_batch_container =
             (MESSAGE_HANDLE)
             (body_binary_data.bytes + (long)send_pending_events_state.message_batch_container);
      }
    }
    else {
      l_3 = xlogging_get_log_function();
      if (l_3 != (LOGGER_LOG)0x0) {
        (*l_3)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
               ,"send_pending_events",0x4b1,1,
               "message_create_uamqp_encoding_from_iothub_message() failed.  Will continue to try to process messages, result"
              );
      }
      invoke_callback_on_error
                (caller_info_00,TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_ERROR_CANNOT_PARSE);
      free(caller_info_00);
    }
  } while( true );
}

Assistant:

static int send_pending_events(TELEMETRY_MESSENGER_INSTANCE* instance)
{
    int result = RESULT_OK;

    MESSENGER_SEND_EVENT_CALLER_INFORMATION* caller_info;
    BINARY_DATA body_binary_data;

    SEND_PENDING_EVENTS_STATE send_pending_events_state;
    memset(&send_pending_events_state, 0, sizeof(send_pending_events_state));
    memset(&body_binary_data, 0, sizeof(body_binary_data));

    uint64_t max_messagesize = 0;

    while ((caller_info = get_next_caller_message_to_send(instance)) != NULL)
    {
        if (body_binary_data.bytes != NULL)
        {
            // Free here as this may have been set during previous run through loop.
            free((unsigned char*)body_binary_data.bytes);
        }
        memset(&body_binary_data, 0, sizeof(body_binary_data));

        if ((0 == max_messagesize) && (get_max_message_size_for_batching(instance, &max_messagesize)) != 0)
        {
            LogError("get_max_message_size_for_batching failed");
            invoke_callback_on_error(caller_info, TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_ERROR_FAIL_SENDING);
            free(caller_info);
            result = MU_FAILURE;
            break;
        }
        else if ((send_pending_events_state.task == 0) && (create_send_pending_events_state(instance, &send_pending_events_state) != 0))
        {
            LogError("create_send_pending_events_state failed");
            invoke_callback_on_error(caller_info, TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_ERROR_FAIL_SENDING);
            free(caller_info);
            result = MU_FAILURE;
            break;
        }
        else if (message_create_uamqp_encoding_from_iothub_message(send_pending_events_state.message_batch_container, caller_info->message->messageHandle, &body_binary_data) != RESULT_OK)
        {
            LogError("message_create_uamqp_encoding_from_iothub_message() failed.  Will continue to try to process messages, result");
            invoke_callback_on_error(caller_info, TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_ERROR_CANNOT_PARSE);
            free(caller_info);
            continue;
        }
        else if (body_binary_data.length > (int)max_messagesize)
        {
            LogError("a single message will encode to be %lu bytes, larger than max we will send the link %" PRIu64 ".  Will continue to try to process messages", (unsigned long)body_binary_data.length, max_messagesize);
            invoke_callback_on_error(caller_info, TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_ERROR_FAIL_SENDING);
            free(caller_info);
            continue;
        }
        else if (send_pending_events_state.task == NULL ||
                 singlylinkedlist_add(send_pending_events_state.task->callback_list, (void*)caller_info) == NULL)
        {
            LogError("singlylinkedlist_add failed");
            invoke_callback_on_error(caller_info, TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_ERROR_FAIL_SENDING);
            free(caller_info);
            result = MU_FAILURE;
            break;
        }

        // Once we've added the caller_info to the callback_list, don't directly 'invoke_callback_on_error' anymore directly.
        // The task is responsible for running through its callers for callbacks, even for errors in this function.
        // Similarly, responsibility for freeing this memory falls on the 'task' cleanup also.

        if (body_binary_data.length + send_pending_events_state.bytes_pending > max_messagesize)
        {
            // If we tried to add the current message, we would overflow.  Send what we've queued immediately.
            if (send_batched_message_and_reset_state(instance, &send_pending_events_state) != RESULT_OK)
            {
                LogError("send_batched_message_and_reset_state failed");
                result = MU_FAILURE;
                break;
            }

            // Now that we've given off the task to uAMQP layer, allocate a new task.
            if (create_send_pending_events_state(instance, &send_pending_events_state) != 0)
            {
                LogError("create_send_pending_events_state failed, result");
                result = MU_FAILURE;
                break;
            }
        }

        if (message_add_body_amqp_data(send_pending_events_state.message_batch_container, body_binary_data) != 0)
        {
            LogError("message_add_body_amqp_data failed");
            result = MU_FAILURE;
            break;
        }

        send_pending_events_state.bytes_pending += body_binary_data.length;
    }

    if ((result == 0) && (send_pending_events_state.bytes_pending != 0))
    {
        if (send_batched_message_and_reset_state(instance, &send_pending_events_state) != RESULT_OK)
        {
            LogError("send_batched_message_and_reset_state failed");
            result = MU_FAILURE;
        }
    }

    if (body_binary_data.bytes != NULL)
    {
        free((unsigned char*)body_binary_data.bytes);
    }

    // A non-NULL task indicates error, since otherwise send_batched_message_and_reset_state would've sent off messages and reset send_pending_events_state
    if (send_pending_events_state.task != NULL)
    {
        TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT send_result = TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_ERROR_FAIL_SENDING;
        singlylinkedlist_foreach(send_pending_events_state.task->callback_list, invoke_callback, (void*)&send_result);
        remove_event_from_in_progress_list(send_pending_events_state.task);
        free_task(send_pending_events_state.task);
    }

    if (send_pending_events_state.message_batch_container != NULL)
    {
        message_destroy(send_pending_events_state.message_batch_container);
    }

    return result;
}